

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_empty(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  uint uVar1;
  anon_union_8_3_18420de5_for_x aVar2;
  
  if (nArg < 1) {
    aVar2.rVal = 4.94065645841247e-324;
  }
  else {
    uVar1 = jx9_value_is_empty(*apArg);
    aVar2.iVal._4_4_ = 0;
    aVar2.iVal._0_4_ = uVar1;
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  pObj->x = aVar2;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_empty(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int res = 1; /* Assume empty by default */
	if( nArg > 0 ){
		res = jx9_value_is_empty(apArg[0]);
	}
	jx9_result_bool(pCtx, res);
	return JX9_OK;
	
}